

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Collision_PDU::Decode(Collision_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Collision_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x3c) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_IssuingEntityID);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,(DataTypeBase *)&this->m_CollidingEntityID);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,(DataTypeBase *)&this->m_EventID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8CollisionType);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Padding);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_Velocity).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32Mass);
  DATA_TYPE::operator>>(pKVar2,&(this->m_Location).super_DataTypeBase);
  return;
}

Assistant:

void Collision_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < COLLISION_PDU_SIZE  )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_IssuingEntityID
           >> KDIS_STREAM m_CollidingEntityID
           >> KDIS_STREAM m_EventID
           >> m_ui8CollisionType
           >> m_ui8Padding
           >> KDIS_STREAM m_Velocity
           >> m_f32Mass
           >> KDIS_STREAM m_Location;
}